

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

int __thiscall CEditor::GetLineDistance(CEditor *this)

{
  int LineDistance;
  CEditor *this_local;
  
  LineDistance = 0x200;
  if (this->m_ZoomLevel < 0x65) {
    LineDistance = 0x10;
  }
  else if (this->m_ZoomLevel < 0xfb) {
    LineDistance = 0x20;
  }
  else if (this->m_ZoomLevel < 0x1c3) {
    LineDistance = 0x40;
  }
  else if (this->m_ZoomLevel < 0x353) {
    LineDistance = 0x80;
  }
  else if (this->m_ZoomLevel < 0x60f) {
    LineDistance = 0x100;
  }
  return LineDistance;
}

Assistant:

int CEditor::GetLineDistance() const
{
	int LineDistance = 512;

	if(m_ZoomLevel <= 100)
		LineDistance = 16;
	else if(m_ZoomLevel <= 250)
		LineDistance = 32;
	else if(m_ZoomLevel <= 450)
		LineDistance = 64;
	else if(m_ZoomLevel <= 850)
		LineDistance = 128;
	else if(m_ZoomLevel <= 1550)
		LineDistance = 256;

	return LineDistance;
}